

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O0

void __thiscall Threadpool<Workerthread>::exit(Threadpool<Workerthread> *this,int __status)

{
  bool bVar1;
  reference ppWVar2;
  Workerthread **t;
  iterator __end0;
  iterator __begin0;
  vector<Workerthread_*,_std::allocator<Workerthread_*>_> *__range2;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  Threadpool<Workerthread> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m);
  std::atomic<bool>::operator=(&this->stop,true);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
  __end0 = std::vector<Workerthread_*,_std::allocator<Workerthread_*>_>::begin(&this->workers);
  t = (Workerthread **)
      std::vector<Workerthread_*,_std::allocator<Workerthread_*>_>::end(&this->workers);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<Workerthread_**,_std::vector<Workerthread_*,_std::allocator<Workerthread_*>_>_>
                      (&__end0,(__normal_iterator<Workerthread_**,_std::vector<Workerthread_*,_std::allocator<Workerthread_*>_>_>
                                *)&t);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppWVar2 = __gnu_cxx::
              __normal_iterator<Workerthread_**,_std::vector<Workerthread_*,_std::allocator<Workerthread_*>_>_>
              ::operator*(&__end0);
    Workerthread::thread(*ppWVar2);
    std::thread::join();
    if (*ppWVar2 != (Workerthread *)0x0) {
      (*(*ppWVar2)->_vptr_Workerthread[1])();
    }
    __gnu_cxx::
    __normal_iterator<Workerthread_**,_std::vector<Workerthread_*,_std::allocator<Workerthread_*>_>_>
    ::operator++(&__end0);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void exit() {
		std::unique_lock<std::mutex> lock(m);
		stop = true;
		cv_task.notify_all();
		lock.unlock();
		for (auto& t : workers) {
			t->thread().join();
			delete t;
		}
	}